

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O0

int Gia_ManCountFlops(Gia_Man_t *p,Vec_Int_t *vOuts)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj_00;
  bool bVar3;
  int iOut;
  int RetValue;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vRoots;
  int Limit;
  Vec_Int_t *vOuts_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(100);
  for (iOut = 0; iVar1 = Vec_IntSize(vOuts), iOut < iVar1; iOut = iOut + 1) {
    iVar1 = Vec_IntEntry(vOuts,iOut);
    _RetValue = Gia_ManPo(p,iVar1);
    iVar1 = Gia_ObjId(p,_RetValue);
    Vec_IntPush(p_00,iVar1);
  }
  Gia_ManIncrementTravId(p);
  pObj_00 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pObj_00);
  iOut = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p_00);
    bVar3 = false;
    if (iOut < iVar1) {
      iVar1 = Vec_IntEntry(p_00,iOut);
      _RetValue = Gia_ManObj(p,iVar1);
      bVar3 = _RetValue != (Gia_Obj_t *)0x0;
    }
    if ((!bVar3) || (iVar1 = Gia_ManConeMark_rec(p,_RetValue,p_00,1000000000), iVar1 != 0)) break;
    iOut = iOut + 1;
  }
  iVar1 = Vec_IntSize(p_00);
  iVar2 = Vec_IntSize(vOuts);
  Vec_IntFree(p_00);
  return iVar1 - iVar2;
}

Assistant:

int Gia_ManCountFlops( Gia_Man_t * p, Vec_Int_t * vOuts )
{
    int Limit = ABC_INFINITY;
    Vec_Int_t * vRoots;
    Gia_Obj_t * pObj;
    int i, RetValue, iOut;
    // start the outputs
    vRoots = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vOuts, iOut, i )
    {
        pObj = Gia_ManPo( p, iOut );
        Vec_IntPush( vRoots, Gia_ObjId(p, pObj) );
    }
    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Gia_ManForEachObjVec( vRoots, p, pObj, i )
        if ( Gia_ManConeMark_rec( p, pObj, vRoots, Limit ) )
            break;
    RetValue = Vec_IntSize( vRoots ) - Vec_IntSize(vOuts);
    Vec_IntFree( vRoots );
    return RetValue;
}